

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

vector<Lesson,_std::allocator<Lesson>_> *
find_free_spot_for_lesson
          (vector<Lesson,_std::allocator<Lesson>_> *__return_storage_ptr__,Group *group,
          string *lesson_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>_>_>_>
          *possible_places,bool doubled)

{
  pointer pLVar1;
  _Base_ptr __n;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  Lesson *pLVar6;
  bool bVar7;
  int iVar8;
  _Rb_tree_header *p_Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer piVar11;
  _Base_ptr p_Var12;
  pointer pLVar13;
  pointer pLVar14;
  vector<int,_std::allocator<int>_> busy_ids;
  vector<Lesson,_std::allocator<Lesson>_> all_lessons_with_this_name;
  Lesson lesson;
  iterator __end4;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  Lesson lesson_2;
  
  busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lesson,_std::allocator<Lesson>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lesson,_std::allocator<Lesson>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lesson,_std::allocator<Lesson>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar14 = (group->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
            super__Vector_impl_data._M_start;
  pLVar1 = (group->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar14 != pLVar1) {
    do {
      Lesson::Lesson(&lesson,pLVar14);
      iVar8 = std::__cxx11::string::compare((char *)&lesson.subject);
      if (iVar8 != 0) {
        lesson_2.lesson_id._0_4_ = (int)lesson.lesson_id;
        if (busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&busy_ids,
                     (iterator)
                     busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&lesson_2);
        }
        else {
          *busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = (int)lesson.lesson_id;
          busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)lesson.time._M_dataplus._M_p != &lesson.time.field_2) {
        operator_delete(lesson.time._M_dataplus._M_p,lesson.time.field_2._M_allocated_capacity + 1);
      }
      std::vector<Professor,_std::allocator<Professor>_>::~vector(&lesson.prep_list);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)lesson.professor._M_dataplus._M_p != &lesson.professor.field_2) {
        operator_delete(lesson.professor._M_dataplus._M_p,
                        lesson.professor.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)lesson.room._M_dataplus._M_p != &lesson.room.field_2) {
        operator_delete(lesson.room._M_dataplus._M_p,lesson.room.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)lesson.subject._M_dataplus._M_p != &lesson.subject.field_2) {
        operator_delete(lesson.subject._M_dataplus._M_p,
                        lesson.subject.field_2._M_allocated_capacity + 1);
      }
      pLVar14 = pLVar14 + 1;
    } while (pLVar14 != pLVar1);
  }
  p_Var12 = (possible_places->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(possible_places->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var12 != p_Var9) {
    paVar10 = &lesson.time.field_2;
    bVar7 = false;
    do {
      __n = p_Var12[1]._M_parent;
      if ((__n == (_Base_ptr)lesson_name->_M_string_length) &&
         ((__n == (_Base_ptr)0x0 ||
          (iVar8 = bcmp(*(void **)(p_Var12 + 1),(lesson_name->_M_dataplus)._M_p,(size_t)__n),
          iVar8 == 0)))) {
        std::vector<Lesson,_std::allocator<Lesson>_>::vector
                  (&all_lessons_with_this_name,
                   (vector<Lesson,_std::allocator<Lesson>_> *)(p_Var12 + 2));
        std::
        shuffle<__gnu_cxx::__normal_iterator<Lesson*,std::vector<Lesson,std::allocator<Lesson>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>)
                   all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>)
                   all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&rng);
        pLVar14 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pLVar6 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (doubled) {
          for (; pLVar6 != pLVar14; pLVar6 = pLVar6 + 1) {
            Lesson::Lesson(&lesson,pLVar6);
            pLVar1 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pLVar13 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              bVar3 = true;
            }
            else {
              do {
                Lesson::Lesson(&lesson_2,pLVar13);
                lVar5 = CONCAT44(lesson_2.lesson_id._4_4_,(int)lesson_2.lesson_id);
                lVar4 = CONCAT44(lesson.lesson_id._4_4_,(int)lesson.lesson_id);
                bVar3 = true;
                if (((lVar5 - lVar4 == 1) &&
                    (lesson.professor._M_string_length == lesson_2.professor._M_string_length)) &&
                   ((lesson.professor._M_string_length == 0 ||
                    (iVar8 = bcmp(lesson.professor._M_dataplus._M_p,
                                  lesson_2.professor._M_dataplus._M_p,
                                  lesson.professor._M_string_length), iVar8 == 0)))) {
                  if (busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    bVar2 = true;
                    piVar11 = busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    do {
                      bVar2 = (bool)(bVar2 & (lVar5 != *piVar11 && lVar4 != *piVar11));
                      piVar11 = piVar11 + 1;
                    } while (piVar11 !=
                             busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish);
                    bVar3 = true;
                    if (!bVar2) goto LAB_0010f0b3;
                  }
                  std::vector<Lesson,_std::allocator<Lesson>_>::push_back
                            (__return_storage_ptr__,&lesson);
                  std::vector<Lesson,_std::allocator<Lesson>_>::push_back
                            (__return_storage_ptr__,&lesson_2);
                  bVar7 = true;
                  bVar3 = false;
                }
LAB_0010f0b3:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)lesson_2.time._M_dataplus._M_p != &lesson_2.time.field_2) {
                  operator_delete(lesson_2.time._M_dataplus._M_p,
                                  lesson_2.time.field_2._M_allocated_capacity + 1);
                }
                std::vector<Professor,_std::allocator<Professor>_>::~vector(&lesson_2.prep_list);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)lesson_2.professor._M_dataplus._M_p != &lesson_2.professor.field_2) {
                  operator_delete(lesson_2.professor._M_dataplus._M_p,
                                  lesson_2.professor.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)lesson_2.room._M_dataplus._M_p != &lesson_2.room.field_2) {
                  operator_delete(lesson_2.room._M_dataplus._M_p,
                                  lesson_2.room.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)lesson_2.subject._M_dataplus._M_p != &lesson_2.subject.field_2) {
                  operator_delete(lesson_2.subject._M_dataplus._M_p,
                                  lesson_2.subject.field_2._M_allocated_capacity + 1);
                }
                pLVar13 = pLVar13 + 1;
              } while ((bool)(bVar3 & pLVar13 != pLVar1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)lesson.time._M_dataplus._M_p != paVar10) {
              operator_delete(lesson.time._M_dataplus._M_p,
                              lesson.time.field_2._M_allocated_capacity + 1);
            }
            std::vector<Professor,_std::allocator<Professor>_>::~vector(&lesson.prep_list);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)lesson.professor._M_dataplus._M_p != &lesson.professor.field_2) {
              operator_delete(lesson.professor._M_dataplus._M_p,
                              lesson.professor.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)lesson.room._M_dataplus._M_p != &lesson.room.field_2) {
              operator_delete(lesson.room._M_dataplus._M_p,
                              lesson.room.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)lesson.subject._M_dataplus._M_p != &lesson.subject.field_2) {
              operator_delete(lesson.subject._M_dataplus._M_p,
                              lesson.subject.field_2._M_allocated_capacity + 1);
            }
            if (!bVar3) goto LAB_0010f53d;
          }
        }
        else {
          for (; pLVar6 != pLVar14; pLVar6 = pLVar6 + 1) {
            Lesson::Lesson(&lesson,pLVar6);
            if (busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
LAB_0010f26d:
              bVar3 = true;
              std::vector<Lesson,_std::allocator<Lesson>_>::push_back
                        (__return_storage_ptr__,&lesson);
              bVar7 = true;
            }
            else {
              bVar3 = true;
              piVar11 = busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                bVar3 = (bool)(bVar3 & CONCAT44(lesson.lesson_id._4_4_,(int)lesson.lesson_id) !=
                                       (long)*piVar11);
                piVar11 = piVar11 + 1;
              } while (piVar11 !=
                       busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
              if (bVar3) goto LAB_0010f26d;
              bVar3 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)lesson.time._M_dataplus._M_p != paVar10) {
              operator_delete(lesson.time._M_dataplus._M_p,
                              lesson.time.field_2._M_allocated_capacity + 1);
            }
            std::vector<Professor,_std::allocator<Professor>_>::~vector(&lesson.prep_list);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)lesson.professor._M_dataplus._M_p != &lesson.professor.field_2) {
              operator_delete(lesson.professor._M_dataplus._M_p,
                              lesson.professor.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)lesson.room._M_dataplus._M_p != &lesson.room.field_2) {
              operator_delete(lesson.room._M_dataplus._M_p,
                              lesson.room.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)lesson.subject._M_dataplus._M_p != &lesson.subject.field_2) {
              operator_delete(lesson.subject._M_dataplus._M_p,
                              lesson.subject.field_2._M_allocated_capacity + 1);
            }
            if (bVar3) goto LAB_0010f53d;
          }
        }
        std::vector<Lesson,_std::allocator<Lesson>_>::~vector(&all_lessons_with_this_name);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var9);
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118);
  Lesson::Lesson(&lesson,0,false,false,false,&local_138,&local_158,&local_f8,&local_118);
  std::vector<Lesson,_std::allocator<Lesson>_>::emplace_back<Lesson>(__return_storage_ptr__,&lesson)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lesson.time._M_dataplus._M_p != &lesson.time.field_2) {
    operator_delete(lesson.time._M_dataplus._M_p,lesson.time.field_2._M_allocated_capacity + 1);
  }
  std::vector<Professor,_std::allocator<Professor>_>::~vector(&lesson.prep_list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lesson.professor._M_dataplus._M_p != &lesson.professor.field_2) {
    operator_delete(lesson.professor._M_dataplus._M_p,
                    lesson.professor.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lesson.room._M_dataplus._M_p != &lesson.room.field_2) {
    operator_delete(lesson.room._M_dataplus._M_p,lesson.room.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lesson.subject._M_dataplus._M_p != &lesson.subject.field_2) {
    operator_delete(lesson.subject._M_dataplus._M_p,lesson.subject.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
LAB_0010f558:
  if (busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
LAB_0010f53d:
  std::vector<Lesson,_std::allocator<Lesson>_>::~vector(&all_lessons_with_this_name);
  if (!bVar7) {
    std::vector<Lesson,_std::allocator<Lesson>_>::~vector(__return_storage_ptr__);
  }
  goto LAB_0010f558;
}

Assistant:

std::vector<Lesson> find_free_spot_for_lesson(Group group, std::string lesson_name, std::map<std::string, std::vector<Lesson>> possible_places, bool doubled) {
    //BUSY IDS
    std::vector<int> busy_ids;
    std::vector<Lesson> new_lessons;
    for (auto lesson:group.lesson_map) {
        if (lesson.subject != "")
            busy_ids.push_back(lesson.lesson_id);
    }

    for(const auto & it: possible_places) {
        if(it.first == lesson_name) {
            std::vector<Lesson> all_lessons_with_this_name = it.second;
            std::shuffle(std::begin(all_lessons_with_this_name), std::end(all_lessons_with_this_name), rng); //shuffle lessons
            if(doubled == false) {
                for (auto lesson:all_lessons_with_this_name) {
                    bool flag = true;
                    for (auto id: busy_ids) {
                       if (lesson.lesson_id == id)
                           flag = false;
                   }
                   if (flag == true) {
                       new_lessons.push_back(lesson);
                        //std::cout<<lesson_name << std::endl;
                        //lesson.print();
                        //std::cout<<lesson.lesson_id<<std::endl;
                        return new_lessons;
                   }

                }
            }
            else {
                for(auto lesson_1: all_lessons_with_this_name) {
                    for(auto lesson_2: all_lessons_with_this_name) {
                        bool flag = true;
                        if (((lesson_2.lesson_id - lesson_1.lesson_id) == 1) && (lesson_1.professor == lesson_2.professor)) {

                            for(auto id: busy_ids) {
                                if ((lesson_1.lesson_id == id) || (lesson_2.lesson_id == id))
                                    flag = false;
                            }
                            if (flag == true) {
                                new_lessons.push_back(lesson_1);
                                new_lessons.push_back(lesson_2);
                                return new_lessons;
                            }
                        }


                    }
                }
            }
        }
    }
    new_lessons.push_back(Lesson());
    return new_lessons;
}